

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

int __thiscall IsoWriter::close(IsoWriter *this,int __fd)

{
  ulong uVar1;
  int iVar2;
  int64_t iVar3;
  size_t __n;
  int local_18;
  int local_14;
  int i_1;
  int i;
  IsoWriter *this_local;
  
  iVar2 = (int)this;
  if ((this->m_opened & 1U) != 0) {
    memset(this->m_buffer,0,0x800);
    while (iVar3 = File::size(&this->m_file), iVar3 % 0x10000 != 0xf800) {
      File::write(&this->m_file,iVar2 + 0xa0,(void *)0x800,0x10000);
    }
    iVar3 = File::size(&this->m_file);
    this->m_metadataMirrorLBN = (int)(iVar3 / 0x800) + 1;
    this->m_tagLocationBaseAddr = this->m_partitionStartAddress;
    writeExtendedFileEntryDescriptor
              (this,false,'\0',MetadataMirror,(long)this->m_metadataFileLen,
               this->m_metadataMirrorLBN - this->m_partitionStartAddress,0,(ExtentList *)0x0);
    memset(this->m_buffer,0,0x800);
    for (local_14 = 0; uVar1 = (long)this->m_metadataFileLen / 0x800, local_14 < (int)uVar1;
        local_14 = local_14 + 1) {
      File::write(&this->m_file,iVar2 + 0xa0,(void *)0x800,uVar1 & 0xffffffff);
    }
    iVar3 = File::size(&this->m_file);
    __n = 0x800;
    this->m_partitionEndAddress = (int)(iVar3 / 0x800);
    memset(this->m_buffer,0,0x800);
    for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
      File::write(&this->m_file,iVar2 + 0xa0,(void *)0x800,__n);
    }
    allocateMetadata(this);
    this->m_tagLocationBaseAddr = this->m_metadataMirrorLBN;
    writeMetadata(this,this->m_metadataMirrorLBN);
    File::seek(&this->m_file,0x90000,smBegin);
    this->m_tagLocationBaseAddr = this->m_partitionStartAddress;
    writeExtendedFileEntryDescriptor
              (this,false,'\0',Metadata,(long)this->m_metadataFileLen,
               this->m_metadataLBN - this->m_partitionStartAddress,0,(ExtentList *)0x0);
    this->m_tagLocationBaseAddr = this->m_metadataLBN;
    writeMetadata(this,this->m_metadataLBN);
    writeDescriptors(this);
    this->m_opened = false;
  }
  return iVar2;
}

Assistant:

void IsoWriter::close()
{
    if (!m_opened)
        return;

    memset(m_buffer, 0, sizeof(m_buffer));
    while (m_file.size() % ALLOC_BLOCK_SIZE != 1024LL * 62) m_file.write(m_buffer, SECTOR_SIZE);

    // mirror metadata file location and length
    m_metadataMirrorLBN = static_cast<int>(m_file.size() / SECTOR_SIZE + 1);
    m_tagLocationBaseAddr = m_partitionStartAddress;
    writeExtendedFileEntryDescriptor(false, 0, FileTypes::MetadataMirror, m_metadataFileLen,
                                     m_metadataMirrorLBN - m_partitionStartAddress, 0);

    // allocate space for metadata mirror file
    memset(m_buffer, 0, sizeof(m_buffer));
    for (int i = 0; i < m_metadataFileLen / SECTOR_SIZE; ++i) m_file.write(m_buffer, SECTOR_SIZE);

    m_partitionEndAddress = static_cast<int>(m_file.size() / SECTOR_SIZE);

    // reserve 64K for EOF anchor volume
    memset(m_buffer, 0, sizeof(m_buffer));
    for (int i = 0; i < 32; ++i) m_file.write(m_buffer, SECTOR_SIZE);

    allocateMetadata();

    m_tagLocationBaseAddr = m_metadataMirrorLBN;
    writeMetadata(m_metadataMirrorLBN);  // write metadata mirror file

    m_file.seek(1024LL * 576);
    // metadata file location and length (located at 576K, point to 640K address)
    m_tagLocationBaseAddr = m_partitionStartAddress;
    writeExtendedFileEntryDescriptor(false, 0, FileTypes::Metadata, m_metadataFileLen,
                                     m_metadataLBN - m_partitionStartAddress, 0);
    m_tagLocationBaseAddr = m_metadataLBN;  // Don't know why. Doing just as scenarist does
    writeMetadata(m_metadataLBN);

    writeDescriptors();
    m_opened = false;
}